

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

void __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_name_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char **begin,char *end,string_type *name)

{
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RCX;
  long in_RDX;
  long *in_RSI;
  char **in_RDI;
  unsigned_long in_stack_00000040;
  char *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_00000058;
  error_type in_stack_00000060;
  bool in_stack_00000067;
  char_type in_stack_ffffffffffffffcf;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar1;
  
  eat_ws_<char_const*>
            (in_RCX,in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  std::__cxx11::string::clear();
  while( true ) {
    bVar1 = false;
    if (*in_RSI != in_RDX) {
      bVar1 = compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
              ::is_alnum_((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                           *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    }
    if (bVar1 == false) break;
    std::__cxx11::string::push_back((char)in_RCX);
    *in_RSI = *in_RSI + 1;
  }
  eat_ws_<char_const*>(in_RCX,in_RDI,(char *)(ulong)in_stack_ffffffffffffffd0);
  std::__cxx11::string::empty();
  detail::ensure_(in_stack_00000067,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                  in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

void get_name_(FwdIter &begin, FwdIter end, string_type &name)
    {
        this->eat_ws_(begin, end);
        for(name.clear(); begin != end && this->is_alnum_(*begin); ++begin)
        {
            name.push_back(*begin);
        }
        this->eat_ws_(begin, end);
        BOOST_XPR_ENSURE_(!name.empty(), regex_constants::error_paren, "incomplete extension");
    }